

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMemoryAllocation.h
# Opt level: O0

bool okReserve<int>(vector<int,_std::allocator<int>_> *use_vector,HighsInt dimension)

{
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  bad_alloc *e;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  std::vector<int,_std::allocator<int>_>::reserve
            (unaff_retaddr,CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  return true;
}

Assistant:

bool okReserve(std::vector<T>& use_vector, HighsInt dimension) {
  try {
    use_vector.reserve(dimension);
  } catch (const std::bad_alloc& e) {
    printf("HighsMemoryAllocation::okReserve fails with %s\n", e.what());
    return false;
  }
  return true;
}